

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disasm_distorm.c
# Opt level: O1

void funchook_disasm_x86_rip_relative
               (funchook_disasm_t *disasm,funchook_insn_t *insn,rip_relative_t *rel_disp,
               rip_relative_t *rel_imm)

{
  byte bVar1;
  ushort uVar2;
  uint64_t uVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  
  rel_disp->addr = (insn_t *)0x0;
  rel_disp->raddr = 0;
  iVar11 = 0;
  rel_disp->offset = 0;
  rel_disp->size = 0;
  rel_imm->offset = 0;
  rel_imm->size = 0;
  rel_imm->addr = (insn_t *)0x0;
  rel_imm->raddr = 0;
  lVar6 = 9;
  iVar8 = 0;
  iVar4 = 0;
  do {
    switch(insn->ops[lVar6 + -9].type) {
    case '\0':
      goto switchD_00102a8e_caseD_0;
    case '\x02':
      uVar10 = (uint)insn->ops[lVar6 + -9].size;
      goto LAB_00102ac8;
    case '\x05':
    case '\a':
      uVar10 = (uint)insn->dispSize;
LAB_00102ac8:
      uVar10 = uVar10 >> 3;
LAB_00102b03:
      iVar11 = iVar11 + uVar10;
      break;
    case '\x06':
      bVar1 = insn->dispSize;
      if ((bVar1 != 0) && (insn->ops[lVar6 + -9].index == 'J')) {
        uVar3 = insn->disp;
        rel_disp->addr = (insn_t *)((ulong)insn->size + insn->addr + uVar3);
        rel_disp->raddr = uVar3;
        rel_disp->size = (uint)bVar1;
        iVar4 = iVar11;
      }
      uVar10 = (uint)(bVar1 >> 3);
      goto LAB_00102b03;
    case '\b':
      rel_imm->addr = (insn_t *)((ulong)insn->size + insn->addr + (insn->imm).sqword);
      rel_imm->raddr = (intptr_t)insn->imm;
      uVar2 = insn->ops[lVar6 + -9].size;
      rel_imm->size = (uint)uVar2;
      iVar8 = iVar11;
      iVar11 = (uint)(uVar2 >> 3) + iVar11;
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0xd);
switchD_00102a8e_caseD_0:
  uVar2 = insn->opcode;
  uVar10 = (uint)uVar2;
  uVar5 = (uint)uVar2;
  if (uVar2 < 0x1465) {
    if (uVar2 < 0x1282) {
      if (uVar2 < 0x11b2) {
        if (uVar10 != 0x116c && 0x116b < uVar2) {
          uVar7 = (ulong)(uVar10 - 0x116d);
          if (0x3b < uVar10 - 0x116d) goto LAB_00102ea3;
          uVar9 = 0x802002010080401;
          goto LAB_00102e9a;
        }
        if (((0x3b < uVar2 - 0x1128) ||
            ((0x802008008040201U >> ((ulong)(uVar2 - 0x1128) & 0x3f) & 1) == 0)) &&
           (((0x1c < uVar2 - 0x77b || ((0x10204081U >> (uVar2 - 0x77b & 0x1f) & 1) == 0)) &&
            (uVar5 != 0x82c)))) goto LAB_00102ea3;
      }
      else if (((0x3b < uVar2 - 0x11b2) ||
               ((0x800804020100401U >> ((ulong)(uVar2 - 0x11b2) & 0x3f) & 1) == 0)) &&
              ((0x39 < uVar2 - 0x11f7 ||
               ((0x201008040100401U >> ((ulong)(uVar2 - 0x11f7) & 0x3f) & 1) == 0)))) {
        uVar7 = (ulong)(uVar5 - 0x123c);
        if (0x3c < uVar5 - 0x123c) goto LAB_00102ea3;
        uVar9 = 0x1004010040100401;
LAB_00102e9a:
        if ((uVar9 >> (uVar7 & 0x3f) & 1) == 0) goto LAB_00102ea3;
      }
    }
    else if (uVar2 < 0x134f) {
      if (((0x39 < uVar2 - 0x1282) ||
          ((0x200400801002001U >> ((ulong)(uVar2 - 0x1282) & 0x3f) & 1) == 0)) &&
         ((0x3b < uVar2 - 0x12c8 ||
          ((0x802000800400801U >> ((ulong)(uVar2 - 0x12c8) & 0x3f) & 1) == 0)))) {
        uVar7 = (ulong)(uVar10 - 0x130d);
        if (0x33 < uVar10 - 0x130d) goto LAB_00102ea3;
        uVar9 = 0x8004002001001;
        goto LAB_00102e9a;
      }
    }
    else if (uVar2 < 0x13da) {
      if ((0x37 < uVar2 - 0x134f) ||
         ((0x80040010004001U >> ((ulong)(uVar2 - 0x134f) & 0x3f) & 1) == 0)) {
        uVar7 = (ulong)(uVar10 - 0x1393);
        if (0x3a < uVar10 - 0x1393) goto LAB_00102ea3;
        uVar9 = 0x400100010004001;
        goto LAB_00102e9a;
      }
    }
    else if ((0x3a < uVar2 - 0x13da) ||
            ((0x401004010002001U >> ((ulong)(uVar2 - 0x13da) & 0x3f) & 1) == 0)) {
      uVar7 = (ulong)(uVar5 - 0x1421);
      if (0x39 < uVar5 - 0x1421) goto LAB_00102ea3;
      uVar9 = 0x200100200400801;
      goto LAB_00102e9a;
    }
  }
  else if (uVar10 == 0x168e || uVar2 < 0x168e) {
    if (uVar2 < 0x1579) {
      if (uVar10 == 0x14ee || uVar2 < 0x14ee) {
        if ((0x3a < uVar2 - 0x1465) ||
           ((0x401004001000801U >> ((ulong)(uVar2 - 0x1465) & 0x3f) & 1) == 0)) {
          uVar7 = (ulong)(uVar10 - 0x14ab);
          if (0x36 < uVar10 - 0x14ab) goto LAB_00102ea3;
          uVar9 = 0x40008004002001;
          goto LAB_00102e9a;
        }
      }
      else if ((0x36 < uVar2 - 0x14ef) ||
              ((0x40020010004001U >> ((ulong)(uVar2 - 0x14ef) & 0x3f) & 1) == 0)) {
        uVar7 = (ulong)(uVar10 - 0x1533);
        if (0x39 < uVar10 - 0x1533) goto LAB_00102ea3;
        uVar9 = 0x200100040004001;
        goto LAB_00102e9a;
      }
    }
    else if (uVar2 < 0x1602) {
      if ((0x3a < uVar2 - 0x1579) ||
         ((0x400200802008001U >> ((ulong)(uVar2 - 0x1579) & 0x3f) & 1) == 0)) {
        uVar7 = (ulong)(uVar10 - 0x15be);
        if (0x39 < uVar10 - 0x15be) goto LAB_00102ea3;
        uVar9 = 0x200400200400801;
        goto LAB_00102e9a;
      }
    }
    else if ((0x3b < uVar2 - 0x1602) ||
            ((0x800802008002001U >> ((ulong)(uVar2 - 0x1602) & 0x3f) & 1) == 0)) {
      uVar7 = (ulong)(uVar10 - 0x164a);
      if (0x37 < uVar10 - 0x164a) goto LAB_00102ea3;
      uVar9 = 0x80020004002001;
      goto LAB_00102e9a;
    }
  }
  else if (uVar10 == 0x17a0 || uVar2 < 0x17a0) {
    if (uVar2 < 0x171a) {
      if ((0x36 < uVar2 - 0x168f) ||
         ((0x40010008004001U >> ((ulong)(uVar2 - 0x168f) & 0x3f) & 1) == 0)) {
        uVar7 = (ulong)(uVar5 - 0x16d3);
        if (0x2b < uVar5 - 0x16d3) goto LAB_00102ea3;
        uVar9 = 0x80040010001;
        goto LAB_00102e9a;
      }
    }
    else if ((0x36 < uVar2 - 0x171a) ||
            ((0x40080040100401U >> ((ulong)(uVar2 - 0x171a) & 0x3f) & 1) == 0)) {
      uVar7 = (ulong)(uVar5 - 0x175b);
      if (0x39 < uVar5 - 0x175b) goto LAB_00102ea3;
      uVar9 = 0x200400800400801;
      goto LAB_00102e9a;
    }
  }
  else if (uVar10 == 0x182e || uVar2 < 0x182e) {
    if ((0x3b < uVar2 - 0x17a1) ||
       ((0x800400401004001U >> ((ulong)(uVar2 - 0x17a1) & 0x3f) & 1) == 0)) {
      uVar7 = (ulong)(uVar5 - 0x17e9);
      if (0x38 < uVar5 - 0x17e9) goto LAB_00102ea3;
      uVar9 = 0x100040010002001;
      goto LAB_00102e9a;
    }
  }
  else if (((0x36 < uVar2 - 0x182f) ||
           ((0x40010004002001U >> ((ulong)(uVar2 - 0x182f) & 0x3f) & 1) == 0)) &&
          (((0x1b < uVar2 - 0x1875 || ((0x8004001U >> (uVar2 - 0x1875 & 0x1f) & 1) == 0)) &&
           (uVar10 != 0x25f2)))) goto LAB_00102ea3;
  iVar11 = iVar11 + 1;
LAB_00102ea3:
  if (0 < rel_disp->size) {
    rel_disp->offset = ((uint)insn->size - iVar11) + iVar4;
    funchook_log(disasm->funchook,
                 "      ip-relative %08x, absolute address= %016lx, offset=%d, size=%d\n",
                 (ulong)(uint)rel_disp->raddr,rel_disp->addr);
  }
  if (0 < rel_imm->size) {
    rel_imm->offset = ((uint)insn->size - iVar11) + iVar8;
    funchook_log(disasm->funchook,
                 "      ip-relative %08x, absolute address= %016lx, offset=%d, size=%d\n",
                 (ulong)(uint)rel_imm->raddr,rel_imm->addr);
    return;
  }
  return;
}

Assistant:

void funchook_disasm_x86_rip_relative(funchook_disasm_t *disasm, const funchook_insn_t *insn, rip_relative_t *rel_disp, rip_relative_t *rel_imm)
{
    int opsiz = 0;
    int disp_offset = 0;
    int imm_offset = 0;
    int i;

    memset(rel_disp, 0, sizeof(rip_relative_t));
    memset(rel_imm, 0, sizeof(rip_relative_t));

    /*
     * Estimate total operand size and RIP-relative address offsets.
     */
    for (i = 0; i < OPERANDS_NO && insn->ops[i].type != O_NONE; i++) {
        const _Operand *op = &insn->ops[i];
        switch (op->type) {
        case O_IMM:
            opsiz += op->size / 8;
            break;
        case O_PC:
            rel_imm->addr = (uint8_t*)(size_t)(insn->addr + insn->size + insn->imm.addr);
            rel_imm->raddr = (intptr_t)insn->imm.addr;
            rel_imm->size = op->size;
            imm_offset = opsiz;
            opsiz += op->size / 8;
            break;
        case O_SMEM:
            if (insn->dispSize != 0 && op->index == R_RIP) {
                rel_disp->addr = (uint8_t*)(size_t)(insn->addr + insn->size + insn->disp);
                rel_disp->raddr = (intptr_t)insn->disp;
                rel_disp->size = insn->dispSize;
                disp_offset = opsiz;
            }
            opsiz += insn->dispSize / 8;
            break;
        case O_MEM:
        case O_DISP:
            opsiz += insn->dispSize / 8;
            break;
        }
    }
    switch (insn->opcode) {
    /* CMPSD */
    case I_CMPEQSD:
    case I_CMPLTSD:
    case I_CMPLESD:
    case I_CMPUNORDSD:
    case I_CMPNEQSD:
    case I_CMPNLTSD:
    case I_CMPNLESD:
    case I_CMPORDSD:
    case I_VCMPEQSD:
    case I_VCMPLTSD:
    case I_VCMPLESD:
    case I_VCMPUNORDSD:
    case I_VCMPNEQSD:
    case I_VCMPNLTSD:
    case I_VCMPNLESD:
    case I_VCMPORDSD:
    case I_VCMPEQ_UQSD:
    case I_VCMPNGESD:
    case I_VCMPNGTSD:
    case I_VCMPFALSESD:
    case I_VCMPNEQ_OQSD:
    case I_VCMPGESD:
    case I_VCMPGTSD:
    case I_VCMPTRUESD:
    case I_VCMPEQ_OSSD:
    case I_VCMPLT_OQSD:
    case I_VCMPLE_OQSD:
    case I_VCMPUNORD_SSD:
    case I_VCMPNEQ_USSD:
    case I_VCMPNLT_UQSD:
    case I_VCMPNLE_UQSD:
    case I_VCMPORD_SSD:
    case I_VCMPEQ_USSD:
    case I_VCMPNGE_UQSD:
    case I_VCMPNGT_UQSD:
    case I_VCMPFALSE_OSSD:
    case I_VCMPNEQ_OSSD:
    case I_VCMPGE_OQSD:
    case I_VCMPGT_OQSD:
    /* CMPSS */
    case I_CMPEQSS:
    case I_CMPLTSS:
    case I_CMPLESS:
    case I_CMPUNORDSS:
    case I_CMPNEQSS:
    case I_CMPNLTSS:
    case I_CMPNLESS:
    case I_CMPORDSS:
    case I_VCMPEQSS:
    case I_VCMPLTSS:
    case I_VCMPLESS:
    case I_VCMPUNORDSS:
    case I_VCMPNEQSS:
    case I_VCMPNLTSS:
    case I_VCMPNLESS:
    case I_VCMPORDSS:
    case I_VCMPEQ_UQSS:
    case I_VCMPNGESS:
    case I_VCMPNGTSS:
    case I_VCMPFALSESS:
    case I_VCMPNEQ_OQSS:
    case I_VCMPGESS:
    case I_VCMPGTSS:
    case I_VCMPTRUESS:
    case I_VCMPEQ_OSSS:
    case I_VCMPLT_OQSS:
    case I_VCMPLE_OQSS:
    case I_VCMPUNORD_SSS:
    case I_VCMPNEQ_USSS:
    case I_VCMPNLT_UQSS:
    case I_VCMPNLE_UQSS:
    case I_VCMPORD_SSS:
    case I_VCMPEQ_USSS:
    case I_VCMPNGE_UQSS:
    case I_VCMPNGT_UQSS:
    case I_VCMPFALSE_OSSS:
    case I_VCMPNEQ_OSSS:
    case I_VCMPGE_OQSS:
    case I_VCMPGT_OQSS:
    /* CMPPD */
    case I_CMPEQPD:
    case I_CMPLTPD:
    case I_CMPLEPD:
    case I_CMPUNORDPD:
    case I_CMPNEQPD:
    case I_CMPNLTPD:
    case I_CMPNLEPD:
    case I_CMPORDPD:
    case I_VCMPEQPD:
    case I_VCMPLTPD:
    case I_VCMPLEPD:
    case I_VCMPUNORDPD:
    case I_VCMPNEQPD:
    case I_VCMPNLTPD:
    case I_VCMPNLEPD:
    case I_VCMPORDPD:
    case I_VCMPEQ_UQPD:
    case I_VCMPNGEPD:
    case I_VCMPNGTPD:
    case I_VCMPFALSEPD:
    case I_VCMPNEQ_OQPD:
    case I_VCMPGEPD:
    case I_VCMPGTPD:
    case I_VCMPTRUEPD:
    case I_VCMPEQ_OSPD:
    case I_VCMPLT_OQPD:
    case I_VCMPLE_OQPD:
    case I_VCMPUNORD_SPD:
    case I_VCMPNEQ_USPD:
    case I_VCMPNLT_UQPD:
    case I_VCMPNLE_UQPD:
    case I_VCMPORD_SPD:
    case I_VCMPEQ_USPD:
    case I_VCMPNGE_UQPD:
    case I_VCMPNGT_UQPD:
    case I_VCMPFALSE_OSPD:
    case I_VCMPNEQ_OSPD:
    case I_VCMPGE_OQPD:
    case I_VCMPGT_OQPD:
    case I_VCMPTRUE_USPD:
    /* CMPPS */
    case I_CMPEQPS:
    case I_CMPLTPS:
    case I_CMPLEPS:
    case I_CMPUNORDPS:
    case I_CMPNEQPS:
    case I_CMPNLTPS:
    case I_CMPNLEPS:
    case I_CMPORDPS:
    case I_VCMPEQPS:
    case I_VCMPLTPS:
    case I_VCMPLEPS:
    case I_VCMPUNORDPS:
    case I_VCMPNEQPS:
    case I_VCMPNLTPS:
    case I_VCMPNLEPS:
    case I_VCMPORDPS:
    case I_VCMPEQ_UQPS:
    case I_VCMPNGEPS:
    case I_VCMPNGTPS:
    case I_VCMPFALSEPS:
    case I_VCMPNEQ_OQPS:
    case I_VCMPGEPS:
    case I_VCMPGTPS:
    case I_VCMPTRUEPS:
    case I_VCMPEQ_OSPS:
    case I_VCMPLT_OQPS:
    case I_VCMPLE_OQPS:
    case I_VCMPUNORD_SPS:
    case I_VCMPNEQ_USPS:
    case I_VCMPNLT_UQPS:
    case I_VCMPNLE_UQPS:
    case I_VCMPORD_SPS:
    case I_VCMPEQ_USPS:
    case I_VCMPNGE_UQPS:
    case I_VCMPNGT_UQPS:
    case I_VCMPFALSE_OSPS:
    case I_VCMPNEQ_OSPS:
    case I_VCMPGE_OQPS:
    case I_VCMPGT_OQPS:
    case I_VCMPTRUE_USPS:
    /* ohters */
    case I_PI2FD:
    case I_PI2FW:
    case I_PF2IW:
    case I_PF2ID:
    case I_PSWAPD:
    case I_VPBLENDVB:
    case I_PFNACC:
        opsiz++;
    }

    if (rel_disp->size > 0) {
        rel_disp->offset = insn->size - opsiz + disp_offset;
        funchook_log(disasm->funchook, "      ip-relative %08x, absolute address= "ADDR_FMT", offset=%d, size=%d\n",
                     (uint32_t)rel_disp->raddr, (size_t)rel_disp->addr, rel_disp->offset, rel_disp->size);
    }
    if (rel_imm->size > 0) {
        rel_imm->offset = insn->size - opsiz + imm_offset;
        funchook_log(disasm->funchook, "      ip-relative %08x, absolute address= "ADDR_FMT", offset=%d, size=%d\n",
                     (uint32_t)rel_imm->raddr, (size_t)rel_imm->addr, rel_imm->offset, rel_imm->size);
    }
}